

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8dc4::ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test::
~ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test
          (ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, AppendSpanConstByteC0001) {
  constexpr auto test_data_0 = std::array<const std::byte, 3>{
      std::byte{0x02}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_1 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x05}};
  constexpr auto test_data_2 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x10}};
  constexpr auto test_data_3 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_4 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_5 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x10}, std::byte{0x05}};
  constexpr auto test_data_6 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_7 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x10}, std::byte{0x05}};

  do_encode_bytes_test(std::span<const std::byte>(test_data_0));
  do_encode_bytes_test(std::span<const std::byte>(test_data_1));
  do_encode_bytes_test(std::span<const std::byte>(test_data_2));
  do_encode_bytes_test(std::span<const std::byte>(test_data_3));
  do_encode_bytes_test(std::span<const std::byte>(test_data_4));
  do_encode_bytes_test(std::span<const std::byte>(test_data_5));
  do_encode_bytes_test(std::span<const std::byte>(test_data_6));
  do_encode_bytes_test(std::span<const std::byte>(test_data_7));
}